

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Finger.cpp
# Opt level: O0

void __thiscall
Finger::Finger(Finger *this,Vec4i *defect,
              vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *cnt,Rect *boundingBox,
              int maxAngle,bool shouldCheckAngles,bool shouldCheckDist,int index)

{
  int *piVar1;
  int iVar2;
  Vec<int,_4> local_58;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> local_48;
  byte local_2e;
  byte local_2d;
  int local_2c;
  bool shouldCheckDist_local;
  bool shouldCheckAngles_local;
  Rect *pRStack_28;
  int maxAngle_local;
  Rect *boundingBox_local;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *cnt_local;
  Vec4i *defect_local;
  Finger *this_local;
  
  local_2e = shouldCheckDist;
  local_2d = shouldCheckAngles;
  local_2c = maxAngle;
  pRStack_28 = boundingBox;
  boundingBox_local = (Rect *)cnt;
  cnt_local = (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)defect;
  defect_local = (Vec4i *)this;
  cv::Point_<int>::Point_(&this->ptStart);
  cv::Point_<int>::Point_(&this->ptEnd);
  cv::Point_<int>::Point_(&this->ptFar);
  this->maxAngle = (float)local_2c;
  this->minDepth = 0xb;
  this->ok = false;
  this->shouldCheckAngles = (bool)(local_2d & 1);
  this->shouldCheckDist = (bool)(local_2e & 1);
  this->index = index;
  this->hndAngle = -1;
  cv::Rect_<int>::Rect_(&this->boundingBox,pRStack_28);
  piVar1 = cv::Vec<int,_4>::operator[]((Vec<int,_4> *)cnt_local,3);
  iVar2 = *piVar1;
  if (iVar2 < 0) {
    iVar2 = iVar2 + 0xff;
  }
  this->depth = (float)(iVar2 >> 8);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
            (&local_48,
             (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)boundingBox_local);
  cv::Vec<int,_4>::Vec(&local_58,(Vec<int,_4> *)cnt_local);
  getPoints(this,&local_48,&local_58);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~vector(&local_48);
  check(this);
  return;
}

Assistant:

Finger::Finger(const Vec4i &defect, const vector<Point> &cnt, const Rect &boundingBox, int maxAngle,
               bool shouldCheckAngles, bool shouldCheckDist, int index)
        : boundingBox(boundingBox), maxAngle(maxAngle), shouldCheckAngles(shouldCheckAngles),
          shouldCheckDist(shouldCheckDist), index(index) {
    depth = defect[3] / 256;
    getPoints(cnt, defect);
    check();
}